

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRoot *this;
  
  this = (IfcRoot *)operator_new(0xd8);
  *(undefined ***)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 =
       &PTR__Object_008d12a0;
  *(undefined8 *)&this[1].field_0x28 = 0;
  this[1].OwnerHistory.obj = (LazyObject *)0x75a313;
  Assimp::IFC::Schema_2x3::IfcRoot::IfcRoot(this,&PTR_construction_vtable_24__009013f8);
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelDefines_00901360;
  *(undefined ***)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 =
       &PTR__IfcRelDefines_009013d8;
  *(undefined ***)&this->field_0x88 = &PTR__IfcRelDefines_00901388;
  *(undefined ***)&this->field_0x98 = &PTR__IfcRelDefines_009013b0;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 = 0;
  *(undefined8 *)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x18 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelDefines>(db,params,(IfcRelDefines *)this);
  return (Object *)
         ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                 _vptr_ObjectHelper +
         (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper
               [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }